

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::SyncToLiteralsAndBackupInst::Exec
          (SyncToLiteralsAndBackupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Type *this_00;
  ScannerInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  int i;
  uint uVar4;
  undefined4 *puVar5;
  Recycler *alloc;
  uint *puVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  CharCount CVar10;
  Char *pat;
  int i_1;
  undefined1 local_80 [8];
  TrackAllocData data;
  type_info *local_40;
  int local_38;
  
  uVar9 = (this->super_BackupMixin).backup.lower;
  CVar10 = *matchStart;
  if (inputLength - CVar10 < uVar9) {
    *matchStart = inputLength;
LAB_00d4cfcd:
    bVar3 = true;
  }
  else {
    if (*inputOffset < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0x15;
    }
    else {
      if (*inputOffset - CVar10 < uVar9) {
        *inputOffset = CVar10 + uVar9;
      }
      puVar6 = (matcher->literalNextSyncInputOffsets).ptr;
      data._32_8_ = input;
      if (puVar6 == (uint *)0x0) {
        if (4 < (this->super_ScannersMixin).numLiterals) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x9e1,"(numLiterals <= MaxNumSyncLiterals)",
                             "numLiterals <= MaxNumSyncLiterals");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        local_80 = (undefined1  [8])&unsigned_int::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 4;
        data.count = (size_t)anon_var_dwarf_a63c962;
        data.filename._0_4_ = 0x9e3;
        alloc = Memory::Recycler::TrackAllocInfo(matcher->recycler,(TrackAllocData *)local_80);
        puVar6 = (uint *)new__<Memory::Recycler>(0x10,alloc,0x37fe86);
        Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet
                  (&matcher->literalNextSyncInputOffsets,puVar6);
        puVar6 = (matcher->literalNextSyncInputOffsets).ptr;
      }
      if (firstIteration) {
        for (lVar7 = 0; lVar7 < (this->super_ScannersMixin).numLiterals; lVar7 = lVar7 + 1) {
          puVar6[lVar7] = *inputOffset;
        }
      }
      local_38 = -1;
      local_40 = (type_info *)0x0;
      for (lVar7 = 0; uVar9 = (uint)local_40, lVar7 < (this->super_ScannersMixin).numLiterals;
          lVar7 = lVar7 + 1) {
        uVar4 = puVar6[lVar7];
        if (puVar6[lVar7] < *inputOffset) {
          uVar4 = *inputOffset;
        }
        local_80._0_4_ = uVar4;
        pSVar1 = (this->super_ScannersMixin).infos[lVar7].ptr;
        this_00 = &(pSVar1->super_ScannerMixin).scanner;
        CVar10 = (pSVar1->super_ScannerMixin).super_LiteralMixin.length;
        pat = (((matcher->program).ptr)->rep).insts.litbuf.ptr +
              (pSVar1->super_ScannerMixin).super_LiteralMixin.offset;
        if (pSVar1->isEquivClass == true) {
          bVar3 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                            (this_00,(Char *)data._32_8_,inputLength,(CharCount *)local_80,pat,
                             CVar10,matcher->stats);
        }
        else {
          bVar3 = TextbookBoyerMoore<char16_t>::Match<1u,1u>
                            (this_00,(Char *)data._32_8_,inputLength,(CharCount *)local_80,pat,
                             CVar10,matcher->stats);
        }
        CVar10 = inputLength;
        if (bVar3 != false) {
          if ((uint)local_80._0_4_ < uVar9 || local_38 < 0) {
            local_40 = (type_info *)local_80;
          }
          local_40 = (type_info *)((ulong)local_40 & 0xffffffff);
          CVar10 = local_80._0_4_;
          if ((uint)local_80._0_4_ < uVar9 || local_38 < 0) {
            local_38 = (int)lVar7;
          }
        }
        puVar6[lVar7] = CVar10;
      }
      if (local_38 < 0) {
        *matchStart = inputLength;
        goto LAB_00d4cfcd;
      }
      *nextSyncInputOffset = uVar9 + 1;
      uVar4 = (this->super_BackupMixin).backup.upper;
      CVar10 = *matchStart;
      if (uVar4 != 0xffffffff) {
        uVar8 = uVar9 - CVar10;
        if (uVar4 <= uVar9 - CVar10) {
          uVar8 = uVar4;
        }
        CVar10 = uVar9 - uVar8;
        *matchStart = CVar10;
      }
      *inputOffset = CVar10;
      *instPointer = *instPointer + 0x15;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool SyncToLiteralsAndBackupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        int besti = -1;
        CharCount bestMatchOffset = 0;

        if (matcher.literalNextSyncInputOffsets == nullptr)
        {
            Assert(numLiterals <= MaxNumSyncLiterals);
            matcher.literalNextSyncInputOffsets =
                RecyclerNewArrayLeaf(matcher.recycler, CharCount, ScannersMixin::MaxNumSyncLiterals);
        }
        CharCount* literalNextSyncInputOffsets = matcher.literalNextSyncInputOffsets;

        if (firstIteration)
        {
            for (int i = 0; i < numLiterals; i++)
            {
                literalNextSyncInputOffsets[i] = inputOffset;
            }
        }

        for (int i = 0; i < numLiterals; i++)
        {
            CharCount thisMatchOffset = literalNextSyncInputOffsets[i];
            if (inputOffset > thisMatchOffset)
            {
                thisMatchOffset = inputOffset;
            }

            if (infos[i]->isEquivClass
                ? (infos[i]->scanner.Match<CaseInsensitive::EquivClassSize>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    ))
                : (infos[i]->scanner.Match<1>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    )))
            {
                if (besti < 0 || thisMatchOffset < bestMatchOffset)
                {
                    besti = i;
                    bestMatchOffset = thisMatchOffset;
                }

                literalNextSyncInputOffsets[i] = thisMatchOffset;
            }
            else
            {
                literalNextSyncInputOffsets[i] = inputLength;
            }
        }

        if (besti < 0)
        {
            // No literals matched
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = bestMatchOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = bestMatchOffset - matchStart;
            matchStart = bestMatchOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }